

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O3

int lws_wsi_txc_report_manual_txcr_in(lws *wsi,int32_t bump)

{
  lws_callback_function *plVar1;
  int iVar2;
  
  if ((wsi->txc).manual == '\0') {
    iVar2 = 0;
  }
  else {
    plVar1 = wsi->protocol->callback;
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc | 0x80000000;
    iVar2 = (*plVar1)(wsi,LWS_CALLBACK_WSI_TX_CREDIT_GET,wsi->user_space,(void *)0x0,(long)bump);
    wsi->field_0x2df = wsi->field_0x2df & 0x7f;
    if (iVar2 == 0) {
      iVar2 = __lws_rx_flow_control(wsi);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int
lws_wsi_txc_report_manual_txcr_in(struct lws *wsi, int32_t bump)
{
	if (!wsi->txc.manual)
		/*
		 * If we don't care about managing it manually, no need to
		 * report it
		 */
		return 0;

	return user_callback_handle_rxflow(wsi->protocol->callback,
					   wsi, LWS_CALLBACK_WSI_TX_CREDIT_GET,
					   wsi->user_space, NULL, (size_t)bump);
}